

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_builder.c
# Opt level: O2

int gen_builder_struct_call_list
              (fb_output_t *out,fb_compound_type_t *ct,int index,int arg_count,int is_macro)

{
  int iVar1;
  int index_00;
  
  iVar1 = get_total_struct_field_count(ct);
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  index_00 = 0;
  while( true ) {
    if (iVar1 == index_00) break;
    gen_comma(out,index_00,arg_count,is_macro);
    fprintf((FILE *)out->fp,"v%i",(ulong)(uint)(index + index_00));
    index_00 = index_00 + 1;
  }
  return index + index_00;
}

Assistant:

static int gen_builder_struct_call_list(fb_output_t *out, fb_compound_type_t *ct, int index, int arg_count, int is_macro)
{
    int i;
    int len = get_total_struct_field_count(ct);

    for (i = 0; i < len; ++i) {
        gen_comma(out, i, arg_count, is_macro);
        fprintf(out->fp, "v%i", index++);
    }
    return index;
}